

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct32_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar30 = (long)bit;
  lVar35 = lVar30 * 0x100;
  iVar23 = -*(int *)(&DAT_004dee28 + lVar35);
  iVar24 = -*(int *)(&DAT_004dee08 + lVar35);
  iVar25 = -*(int *)(&DAT_004dee10 + lVar35);
  iVar2 = *(int *)(&DAT_004dee20 + lVar35);
  iVar3 = *(int *)(&DAT_004deda0 + lVar35);
  iVar4 = *(int *)(&DAT_004dede0 + lVar35);
  iVar5 = *(int *)(&DAT_004ded60 + lVar30 * 0x20);
  iVar37 = -iVar4;
  iVar34 = -iVar5;
  iVar38 = -iVar2;
  iVar32 = -iVar3;
  iVar6 = *(int *)(&DAT_004dedc0 + lVar35);
  iVar28 = -iVar6;
  iVar7 = *(int *)(&DAT_004dee00 + lVar35);
  iVar29 = -iVar7;
  iVar33 = 1 << ((char)bit - 1U & 0x1f);
  iVar8 = *(int *)(&DAT_004ded80 + lVar35);
  iVar36 = -iVar8;
  iVar31 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_4a0 = 0x8000;
  if (0xf < iVar31) {
    local_4a0 = 1 << ((char)iVar31 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)(&DAT_004dee38 + lVar35);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004ded78 + lVar35);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar55._16_4_ = uVar1;
  auVar55._20_4_ = uVar1;
  auVar55._24_4_ = uVar1;
  auVar55._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dee18 + lVar35);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  local_480 = -local_4a0;
  uVar1 = *(undefined4 *)(&DAT_004ded58 + lVar30 * 0x20);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  local_4a0 = local_4a0 + -1;
  uVar1 = *(undefined4 *)(&DAT_004ded68 + lVar30 * 0x20);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57._16_4_ = uVar1;
  auVar57._20_4_ = uVar1;
  auVar57._24_4_ = uVar1;
  auVar57._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004ded48 + lVar30 * 0x20);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  auVar39._4_4_ = iVar23;
  auVar39._0_4_ = iVar23;
  auVar39._8_4_ = iVar23;
  auVar39._12_4_ = iVar23;
  auVar39._16_4_ = iVar23;
  auVar39._20_4_ = iVar23;
  auVar39._24_4_ = iVar23;
  auVar39._28_4_ = iVar23;
  auVar49._4_4_ = iVar24;
  auVar49._0_4_ = iVar24;
  auVar49._8_4_ = iVar24;
  auVar49._12_4_ = iVar24;
  auVar49._16_4_ = iVar24;
  auVar49._20_4_ = iVar24;
  auVar49._24_4_ = iVar24;
  auVar49._28_4_ = iVar24;
  auVar59 = vpmulld_avx2(auVar59,(undefined1  [32])in[1]);
  auVar54 = vpmulld_avx2(auVar54,(undefined1  [32])in[1]);
  auVar49 = vpmulld_avx2(auVar49,(undefined1  [32])in[7]);
  auVar55 = vpmulld_avx2(auVar55,(undefined1  [32])in[7]);
  auVar57 = vpmulld_avx2(auVar57,(undefined1  [32])in[5]);
  auVar45 = vpmulld_avx2(auVar51,(undefined1  [32])in[5]);
  auVar39 = vpmulld_avx2(auVar39,(undefined1  [32])in[3]);
  auVar51 = vpmulld_avx2(auVar56,(undefined1  [32])in[3]);
  uVar1 = *(undefined4 *)(&DAT_004ded50 + lVar30 * 0x20);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar40 = vpmulld_avx2(auVar40,(undefined1  [32])in[2]);
  uVar1 = *(undefined4 *)(&DAT_004dee30 + lVar35);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar41 = vpmulld_avx2(auVar41,(undefined1  [32])in[2]);
  auVar42._4_4_ = iVar25;
  auVar42._0_4_ = iVar25;
  auVar42._8_4_ = iVar25;
  auVar42._12_4_ = iVar25;
  auVar42._16_4_ = iVar25;
  auVar42._20_4_ = iVar25;
  auVar42._24_4_ = iVar25;
  auVar42._28_4_ = iVar25;
  auVar42 = vpmulld_avx2(auVar42,(undefined1  [32])in[6]);
  uVar1 = *(undefined4 *)(&DAT_004ded70 + lVar30 * 0x20);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar43 = vpmulld_avx2(auVar43,(undefined1  [32])in[6]);
  auVar60._4_4_ = iVar2;
  auVar60._0_4_ = iVar2;
  auVar60._8_4_ = iVar2;
  auVar60._12_4_ = iVar2;
  auVar60._16_4_ = iVar2;
  auVar60._20_4_ = iVar2;
  auVar60._24_4_ = iVar2;
  auVar60._28_4_ = iVar2;
  auVar44._4_4_ = iVar34;
  auVar44._0_4_ = iVar34;
  auVar44._8_4_ = iVar34;
  auVar44._12_4_ = iVar34;
  auVar44._16_4_ = iVar34;
  auVar44._20_4_ = iVar34;
  auVar44._24_4_ = iVar34;
  auVar44._28_4_ = iVar34;
  auVar50._4_4_ = iVar33;
  auVar50._0_4_ = iVar33;
  auVar50._8_4_ = iVar33;
  auVar50._12_4_ = iVar33;
  auVar50._16_4_ = iVar33;
  auVar50._20_4_ = iVar33;
  auVar50._24_4_ = iVar33;
  auVar50._28_4_ = iVar33;
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar9 = vpsrad_avx2(auVar59,ZEXT416((uint)bit));
  auVar59 = vpaddd_avx2(auVar54,auVar50);
  auVar10 = vpsrad_avx2(auVar59,ZEXT416((uint)bit));
  auVar59 = vpmulld_avx2(auVar10,auVar44);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar54 = vpmulld_avx2(auVar9,auVar60);
  auVar59 = vpaddd_avx2(auVar59,auVar54);
  auVar53._4_4_ = iVar5;
  auVar53._0_4_ = iVar5;
  auVar53._8_4_ = iVar5;
  auVar53._12_4_ = iVar5;
  auVar53._16_4_ = iVar5;
  auVar53._20_4_ = iVar5;
  auVar53._24_4_ = iVar5;
  auVar53._28_4_ = iVar5;
  auVar54 = vpmulld_avx2(auVar10,auVar60);
  auVar54 = vpaddd_avx2(auVar54,auVar50);
  auVar56 = vpmulld_avx2(auVar9,auVar53);
  auVar54 = vpaddd_avx2(auVar54,auVar56);
  auVar49 = vpaddd_avx2(auVar49,auVar50);
  auVar66 = ZEXT416((uint)bit);
  auVar11 = vpsrad_avx2(auVar49,auVar66);
  auVar62._4_4_ = iVar38;
  auVar62._0_4_ = iVar38;
  auVar62._8_4_ = iVar38;
  auVar62._12_4_ = iVar38;
  auVar62._16_4_ = iVar38;
  auVar62._20_4_ = iVar38;
  auVar62._24_4_ = iVar38;
  auVar62._28_4_ = iVar38;
  auVar49 = vpaddd_avx2(auVar55,auVar50);
  auVar12 = vpsrad_avx2(auVar49,auVar66);
  auVar55 = vpmulld_avx2(auVar11,auVar62);
  auVar49 = vpmulld_avx2(auVar12,auVar44);
  auVar49 = vpaddd_avx2(auVar49,auVar50);
  auVar49 = vpaddd_avx2(auVar49,auVar55);
  auVar53 = vpmulld_avx2(auVar53,(undefined1  [32])in[4]);
  auVar62 = vpmulld_avx2(auVar60,(undefined1  [32])in[4]);
  auVar56 = vpmulld_avx2(auVar11,auVar44);
  auVar55 = vpmulld_avx2(auVar12,auVar60);
  auVar55 = vpaddd_avx2(auVar50,auVar55);
  auVar55 = vpaddd_avx2(auVar56,auVar55);
  auVar61._4_4_ = iVar3;
  auVar61._0_4_ = iVar3;
  auVar61._8_4_ = iVar3;
  auVar61._12_4_ = iVar3;
  auVar61._16_4_ = iVar3;
  auVar61._20_4_ = iVar3;
  auVar61._24_4_ = iVar3;
  auVar61._28_4_ = iVar3;
  auVar57 = vpaddd_avx2(auVar57,auVar50);
  auVar60 = vpsrad_avx2(auVar57,auVar66);
  auVar63._4_4_ = iVar37;
  auVar63._0_4_ = iVar37;
  auVar63._8_4_ = iVar37;
  auVar63._12_4_ = iVar37;
  auVar63._16_4_ = iVar37;
  auVar63._20_4_ = iVar37;
  auVar63._24_4_ = iVar37;
  auVar63._28_4_ = iVar37;
  auVar57 = vpaddd_avx2(auVar45,auVar50);
  auVar13 = vpsrad_avx2(auVar57,auVar66);
  auVar57 = vpmulld_avx2(auVar13,auVar63);
  auVar57 = vpaddd_avx2(auVar57,auVar50);
  auVar45 = vpmulld_avx2(auVar60,auVar61);
  auVar57 = vpaddd_avx2(auVar57,auVar45);
  auVar45._4_4_ = iVar4;
  auVar45._0_4_ = iVar4;
  auVar45._8_4_ = iVar4;
  auVar45._12_4_ = iVar4;
  auVar45._16_4_ = iVar4;
  auVar45._20_4_ = iVar4;
  auVar45._24_4_ = iVar4;
  auVar45._28_4_ = iVar4;
  auVar56 = vpmulld_avx2(auVar60,auVar45);
  auVar45 = vpmulld_avx2(auVar13,auVar61);
  auVar45 = vpaddd_avx2(auVar45,auVar50);
  auVar45 = vpaddd_avx2(auVar45,auVar56);
  auVar39 = vpaddd_avx2(auVar39,auVar50);
  auVar66 = ZEXT416((uint)bit);
  auVar14 = vpsrad_avx2(auVar39,auVar66);
  auVar39 = vpaddd_avx2(auVar51,auVar50);
  auVar15 = vpsrad_avx2(auVar39,auVar66);
  auVar58._4_4_ = iVar32;
  auVar58._0_4_ = iVar32;
  auVar58._8_4_ = iVar32;
  auVar58._12_4_ = iVar32;
  auVar58._16_4_ = iVar32;
  auVar58._20_4_ = iVar32;
  auVar58._24_4_ = iVar32;
  auVar58._28_4_ = iVar32;
  auVar51 = vpmulld_avx2(auVar14,auVar58);
  auVar39 = vpmulld_avx2(auVar15,auVar63);
  auVar39 = vpaddd_avx2(auVar39,auVar50);
  auVar39 = vpaddd_avx2(auVar51,auVar39);
  auVar56 = vpmulld_avx2(auVar14,auVar63);
  auVar51 = vpmulld_avx2(auVar15,auVar61);
  auVar51 = vpaddd_avx2(auVar51,auVar50);
  auVar51 = vpaddd_avx2(auVar56,auVar51);
  auVar65._4_4_ = iVar7;
  auVar65._0_4_ = iVar7;
  auVar65._8_4_ = iVar7;
  auVar65._12_4_ = iVar7;
  auVar65._16_4_ = iVar7;
  auVar65._20_4_ = iVar7;
  auVar65._24_4_ = iVar7;
  auVar65._28_4_ = iVar7;
  auVar64._4_4_ = iVar36;
  auVar64._0_4_ = iVar36;
  auVar64._8_4_ = iVar36;
  auVar64._12_4_ = iVar36;
  auVar64._16_4_ = iVar36;
  auVar64._20_4_ = iVar36;
  auVar64._24_4_ = iVar36;
  auVar64._28_4_ = iVar36;
  auVar40 = vpaddd_avx2(auVar50,auVar40);
  auVar58 = vpsrad_avx2(auVar40,auVar66);
  auVar40 = vpaddd_avx2(auVar50,auVar41);
  auVar61 = vpsrad_avx2(auVar40,auVar66);
  auVar40 = vpmulld_avx2(auVar61,auVar64);
  auVar40 = vpaddd_avx2(auVar40,auVar50);
  auVar41 = vpmulld_avx2(auVar58,auVar65);
  auVar40 = vpaddd_avx2(auVar40,auVar41);
  auVar52._4_4_ = iVar6;
  auVar52._0_4_ = iVar6;
  auVar52._8_4_ = iVar6;
  auVar52._12_4_ = iVar6;
  auVar52._16_4_ = iVar6;
  auVar52._20_4_ = iVar6;
  auVar52._24_4_ = iVar6;
  auVar52._28_4_ = iVar6;
  auVar46._4_4_ = iVar8;
  auVar46._0_4_ = iVar8;
  auVar46._8_4_ = iVar8;
  auVar46._12_4_ = iVar8;
  auVar46._16_4_ = iVar8;
  auVar46._20_4_ = iVar8;
  auVar46._24_4_ = iVar8;
  auVar46._28_4_ = iVar8;
  auVar44 = vpmulld_avx2(auVar52,(undefined1  [32])*in);
  auVar41 = vpmulld_avx2(auVar61,auVar65);
  auVar56 = vpmulld_avx2(auVar58,auVar46);
  auVar41 = vpaddd_avx2(auVar41,auVar50);
  auVar41 = vpaddd_avx2(auVar41,auVar56);
  auVar42 = vpaddd_avx2(auVar50,auVar42);
  auVar63 = vpsrad_avx2(auVar42,auVar66);
  auVar42 = vpaddd_avx2(auVar50,auVar43);
  auVar16 = vpsrad_avx2(auVar42,auVar66);
  auVar47._4_4_ = iVar29;
  auVar47._0_4_ = iVar29;
  auVar47._8_4_ = iVar29;
  auVar47._12_4_ = iVar29;
  auVar47._16_4_ = iVar29;
  auVar47._20_4_ = iVar29;
  auVar47._24_4_ = iVar29;
  auVar47._28_4_ = iVar29;
  auVar42 = vpmulld_avx2(auVar16,auVar64);
  auVar42 = vpaddd_avx2(auVar42,auVar50);
  auVar43 = vpmulld_avx2(auVar63,auVar47);
  auVar42 = vpaddd_avx2(auVar43,auVar42);
  auVar56 = vpmulld_avx2(auVar63,auVar64);
  auVar43 = vpmulld_avx2(auVar16,auVar65);
  auVar43 = vpaddd_avx2(auVar43,auVar50);
  auVar43 = vpaddd_avx2(auVar43,auVar56);
  auVar56 = vpaddd_avx2(auVar11,auVar10);
  auVar11 = vpsubd_avx2(auVar10,auVar11);
  auVar10 = vpsrad_avx2(auVar59,auVar66);
  auVar49 = vpsrad_avx2(auVar49,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar10);
  auVar19 = vpsubd_avx2(auVar10,auVar49);
  auVar49 = vpaddd_avx2(auVar13,auVar14);
  auVar13 = vpsubd_avx2(auVar14,auVar13);
  auVar66 = ZEXT416((uint)bit);
  auVar10 = vpsrad_avx2(auVar57,auVar66);
  auVar39 = vpsrad_avx2(auVar39,auVar66);
  auVar57 = vpaddd_avx2(auVar39,auVar10);
  auVar14 = vpsubd_avx2(auVar39,auVar10);
  auVar39 = vpaddd_avx2(auVar60,auVar15);
  auVar60 = vpsubd_avx2(auVar15,auVar60);
  auVar10 = vpsrad_avx2(auVar45,auVar66);
  auVar51 = vpsrad_avx2(auVar51,auVar66);
  auVar45 = vpaddd_avx2(auVar51,auVar10);
  auVar20 = vpsubd_avx2(auVar51,auVar10);
  auVar51 = vpaddd_avx2(auVar9,auVar12);
  auVar10 = vpsubd_avx2(auVar9,auVar12);
  auVar9 = vpsrad_avx2(auVar54,auVar66);
  auVar55 = vpsrad_avx2(auVar55,auVar66);
  auVar54 = vpaddd_avx2(auVar55,auVar9);
  auVar9 = vpsubd_avx2(auVar9,auVar55);
  auVar48._4_4_ = iVar28;
  auVar48._0_4_ = iVar28;
  auVar48._8_4_ = iVar28;
  auVar48._12_4_ = iVar28;
  auVar48._16_4_ = iVar28;
  auVar48._20_4_ = iVar28;
  auVar48._24_4_ = iVar28;
  auVar48._28_4_ = iVar28;
  auVar55 = vpaddd_avx2(auVar50,auVar53);
  auVar15 = vpsrad_avx2(auVar55,auVar66);
  auVar55 = vpaddd_avx2(auVar50,auVar62);
  auVar17 = vpsrad_avx2(auVar55,auVar66);
  auVar55 = vpmulld_avx2(auVar17,auVar48);
  auVar55 = vpaddd_avx2(auVar55,auVar50);
  auVar53 = vpmulld_avx2(auVar15,auVar52);
  auVar55 = vpaddd_avx2(auVar55,auVar53);
  auVar53 = vpaddd_avx2(auVar50,auVar44);
  auVar18 = vpsrad_avx2(auVar53,auVar66);
  auVar53 = vpaddd_avx2(auVar63,auVar61);
  auVar21 = vpsubd_avx2(auVar61,auVar63);
  auVar62 = vpsrad_avx2(auVar40,auVar66);
  auVar42 = vpsrad_avx2(auVar42,auVar66);
  auVar40 = vpaddd_avx2(auVar42,auVar62);
  auVar61 = vpsubd_avx2(auVar62,auVar42);
  auVar62 = vpsrad_avx2(auVar41,auVar66);
  auVar41 = vpaddd_avx2(auVar16,auVar58);
  auVar22 = vpsubd_avx2(auVar58,auVar16);
  auVar43 = vpsrad_avx2(auVar43,auVar66);
  auVar42 = vpaddd_avx2(auVar43,auVar62);
  auVar63 = vpsubd_avx2(auVar62,auVar43);
  auVar27._4_4_ = local_480;
  auVar27._0_4_ = local_480;
  auVar27._8_4_ = local_480;
  auVar27._12_4_ = local_480;
  auVar27._16_4_ = local_480;
  auVar27._20_4_ = local_480;
  auVar27._24_4_ = local_480;
  auVar27._28_4_ = local_480;
  auVar43 = vpmaxsd_avx2(auVar19,auVar27);
  auVar26._4_4_ = local_4a0;
  auVar26._0_4_ = local_4a0;
  auVar26._8_4_ = local_4a0;
  auVar26._12_4_ = local_4a0;
  auVar26._16_4_ = local_4a0;
  auVar26._20_4_ = local_4a0;
  auVar26._24_4_ = local_4a0;
  auVar26._28_4_ = local_4a0;
  auVar62 = vpminsd_avx2(auVar43,auVar26);
  auVar43 = vpmaxsd_avx2(auVar9,auVar27);
  auVar44 = vpminsd_avx2(auVar43,auVar26);
  auVar43 = vpmulld_avx2(auVar62,auVar64);
  auVar43 = vpaddd_avx2(auVar43,auVar50);
  auVar9 = vpmulld_avx2(auVar44,auVar65);
  auVar43 = vpaddd_avx2(auVar43,auVar9);
  auVar62 = vpmulld_avx2(auVar62,auVar65);
  auVar44 = vpmulld_avx2(auVar44,auVar46);
  auVar62 = vpaddd_avx2(auVar62,auVar50);
  auVar62 = vpaddd_avx2(auVar62,auVar44);
  auVar44 = vpmaxsd_avx2(auVar27,auVar11);
  auVar9 = vpminsd_avx2(auVar44,auVar26);
  auVar44 = vpmaxsd_avx2(auVar10,auVar27);
  auVar10 = vpminsd_avx2(auVar44,auVar26);
  auVar44 = vpmulld_avx2(auVar10,auVar65);
  auVar44 = vpaddd_avx2(auVar44,auVar50);
  auVar11 = vpmulld_avx2(auVar9,auVar64);
  auVar44 = vpaddd_avx2(auVar11,auVar44);
  auVar10 = vpmulld_avx2(auVar10,auVar46);
  auVar11 = vpmulld_avx2(auVar9,auVar65);
  auVar9 = vpaddd_avx2(auVar50,auVar10);
  auVar9 = vpaddd_avx2(auVar11,auVar9);
  auVar10 = vpmaxsd_avx2(auVar27,auVar13);
  auVar11 = vpminsd_avx2(auVar10,auVar26);
  auVar10 = vpmaxsd_avx2(auVar27,auVar60);
  auVar12 = vpminsd_avx2(auVar10,auVar26);
  auVar10 = vpmulld_avx2(auVar12,auVar64);
  auVar10 = vpaddd_avx2(auVar50,auVar10);
  auVar60 = vpmulld_avx2(auVar11,auVar47);
  auVar10 = vpaddd_avx2(auVar60,auVar10);
  auVar60 = vpmulld_avx2(auVar11,auVar64);
  auVar11 = vpmulld_avx2(auVar12,auVar65);
  auVar11 = vpaddd_avx2(auVar11,auVar50);
  auVar11 = vpaddd_avx2(auVar11,auVar60);
  auVar12 = vpmaxsd_avx2(auVar27,auVar14);
  auVar60 = vpminsd_avx2(auVar12,auVar26);
  auVar12 = vpmaxsd_avx2(auVar27,auVar20);
  auVar13 = vpminsd_avx2(auVar12,auVar26);
  auVar12 = vpmulld_avx2(auVar60,auVar47);
  auVar12 = vpaddd_avx2(auVar12,auVar50);
  auVar14 = vpmulld_avx2(auVar13,auVar64);
  auVar12 = vpaddd_avx2(auVar14,auVar12);
  auVar60 = vpmulld_avx2(auVar60,auVar64);
  auVar13 = vpmulld_avx2(auVar13,auVar65);
  auVar58 = vpsrad_avx2(auVar55,auVar66);
  auVar55 = vpaddd_avx2(auVar60,auVar50);
  auVar55 = vpaddd_avx2(auVar55,auVar13);
  auVar60 = vpaddd_avx2(auVar17,auVar15);
  auVar60 = vpmulld_avx2(auVar60,auVar52);
  auVar60 = vpaddd_avx2(auVar60,auVar50);
  auVar14 = vpsrad_avx2(auVar60,auVar66);
  auVar60 = vpaddd_avx2(auVar15,auVar18);
  auVar19 = vpsubd_avx2(auVar18,auVar15);
  auVar13 = vpaddd_avx2(auVar14,auVar18);
  auVar20 = vpsubd_avx2(auVar18,auVar14);
  auVar14 = vpaddd_avx2(auVar58,auVar18);
  auVar46 = vpsubd_avx2(auVar18,auVar58);
  auVar15 = vpaddd_avx2(auVar17,auVar18);
  auVar47 = vpsubd_avx2(auVar18,auVar17);
  auVar58 = vpmaxsd_avx2(auVar27,auVar61);
  auVar61 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar63);
  auVar63 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmulld_avx2(auVar61,auVar48);
  auVar58 = vpaddd_avx2(auVar58,auVar50);
  auVar16 = vpmulld_avx2(auVar63,auVar52);
  auVar58 = vpaddd_avx2(auVar58,auVar16);
  auVar61 = vpaddd_avx2(auVar63,auVar61);
  auVar63 = vpmaxsd_avx2(auVar27,auVar21);
  auVar16 = vpminsd_avx2(auVar63,auVar26);
  auVar63 = vpmaxsd_avx2(auVar27,auVar22);
  auVar17 = vpminsd_avx2(auVar63,auVar26);
  auVar63 = vpmulld_avx2(auVar16,auVar48);
  auVar63 = vpaddd_avx2(auVar63,auVar50);
  auVar18 = vpmulld_avx2(auVar17,auVar52);
  auVar63 = vpaddd_avx2(auVar63,auVar18);
  auVar16 = vpaddd_avx2(auVar17,auVar16);
  auVar56 = vpmaxsd_avx2(auVar27,auVar56);
  auVar56 = vpminsd_avx2(auVar56,auVar26);
  auVar49 = vpmaxsd_avx2(auVar27,auVar49);
  auVar17 = vpminsd_avx2(auVar49,auVar26);
  auVar49 = vpaddd_avx2(auVar17,auVar56);
  auVar56 = vpsubd_avx2(auVar56,auVar17);
  auVar49 = vpmaxsd_avx2(auVar49,auVar27);
  local_260 = vpminsd_avx2(auVar49,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar59);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar57);
  auVar57 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar57,auVar49);
  auVar17 = vpsubd_avx2(auVar49,auVar57);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_240 = vpminsd_avx2(auVar59,auVar26);
  auVar49 = vpsrad_avx2(auVar43,auVar66);
  auVar66 = ZEXT416((uint)bit);
  auVar57 = vpsrad_avx2(auVar12,auVar66);
  auVar59 = vpaddd_avx2(auVar57,auVar49);
  auVar43 = vpsubd_avx2(auVar49,auVar57);
  auVar49 = vpsrad_avx2(auVar44,auVar66);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_220 = vpminsd_avx2(auVar59,auVar26);
  auVar57 = vpsrad_avx2(auVar10,auVar66);
  auVar59 = vpaddd_avx2(auVar57,auVar49);
  auVar44 = vpsubd_avx2(auVar49,auVar57);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_200 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar39);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar51);
  auVar57 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar57,auVar49);
  auVar39 = vpsubd_avx2(auVar57,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_80 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar45);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar54);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar51 = vpsubd_avx2(auVar54,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_a0 = vpminsd_avx2(auVar59,auVar26);
  auVar54 = vpsrad_avx2(auVar62,auVar66);
  auVar49 = vpsrad_avx2(auVar55,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar62 = vpsubd_avx2(auVar54,auVar49);
  auVar54 = vpsrad_avx2(auVar9,auVar66);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_c0 = vpminsd_avx2(auVar59,auVar26);
  auVar49 = vpsrad_avx2(auVar11,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar9 = vpsubd_avx2(auVar54,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_e0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar41);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar60);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar49,auVar54);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_460 = (__m256i)vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_280 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar42);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar13);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar49,auVar54);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_440 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_2a0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar14);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmulld_avx2(auVar61,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar49 = vpsrad_avx2(auVar59,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar54,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_420 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_2c0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar15);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmulld_avx2(auVar16,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar49 = vpsrad_avx2(auVar59,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar54,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_400 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_2e0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar47);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar49 = vpsrad_avx2(auVar63,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar54,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_3e0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_300 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar46);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar49 = vpsrad_avx2(auVar58,auVar66);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar54,auVar49);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_3c0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_320 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar40);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar20);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpsubd_avx2(auVar49,auVar54);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  local_3a0 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar54,auVar27);
  local_340 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar53);
  auVar54 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpmaxsd_avx2(auVar27,auVar19);
  auVar49 = vpminsd_avx2(auVar59,auVar26);
  auVar59 = vpaddd_avx2(auVar49,auVar54);
  auVar41 = vpsubd_avx2(auVar49,auVar54);
  auVar54 = vpmaxsd_avx2(auVar27,auVar56);
  auVar49 = vpmaxsd_avx2(auVar27,auVar17);
  auVar55 = vpmaxsd_avx2(auVar27,auVar43);
  auVar57 = vpmaxsd_avx2(auVar44,auVar27);
  auVar45 = vpmaxsd_avx2(auVar39,auVar27);
  auVar39 = vpmaxsd_avx2(auVar51,auVar27);
  auVar51 = vpmaxsd_avx2(auVar62,auVar27);
  auVar40 = vpmaxsd_avx2(auVar9,auVar27);
  auVar59 = vpmaxsd_avx2(auVar59,auVar27);
  auVar41 = vpmaxsd_avx2(auVar41,auVar27);
  auVar42 = vpminsd_avx2(auVar54,auVar26);
  auVar49 = vpminsd_avx2(auVar49,auVar26);
  auVar55 = vpminsd_avx2(auVar55,auVar26);
  auVar54 = vpminsd_avx2(auVar57,auVar26);
  auVar57 = vpminsd_avx2(auVar45,auVar26);
  auVar45 = vpminsd_avx2(auVar39,auVar26);
  auVar39 = vpminsd_avx2(auVar51,auVar26);
  auVar51 = vpminsd_avx2(auVar40,auVar26);
  local_380 = vpminsd_avx2(auVar59,auVar26);
  local_360 = vpminsd_avx2(auVar41,auVar26);
  auVar59 = vpmulld_avx2(auVar54,auVar48);
  auVar40 = vpmulld_avx2(auVar51,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar59 = vpaddd_avx2(auVar59,auVar40);
  auVar54 = vpaddd_avx2(auVar54,auVar51);
  local_1e0 = vpsrad_avx2(auVar59,auVar66);
  auVar59 = vpmulld_avx2(auVar54,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  local_100 = vpsrad_avx2(auVar59,auVar66);
  auVar59 = vpmulld_avx2(auVar55,auVar48);
  auVar54 = vpmulld_avx2(auVar39,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar59 = vpaddd_avx2(auVar59,auVar54);
  auVar54 = vpaddd_avx2(auVar55,auVar39);
  local_1c0 = vpsrad_avx2(auVar59,auVar66);
  auVar59 = vpmulld_avx2(auVar54,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  local_120 = vpsrad_avx2(auVar59,auVar66);
  auVar59 = vpmulld_avx2(auVar49,auVar48);
  auVar54 = vpmulld_avx2(auVar45,auVar52);
  auVar59 = vpaddd_avx2(auVar59,auVar50);
  auVar59 = vpaddd_avx2(auVar59,auVar54);
  auVar54 = vpaddd_avx2(auVar45,auVar49);
  auVar54 = vpmulld_avx2(auVar54,auVar52);
  auVar54 = vpaddd_avx2(auVar54,auVar50);
  local_140 = vpsrad_avx2(auVar54,auVar66);
  local_1a0 = vpsrad_avx2(auVar59,auVar66);
  auVar54 = vpmulld_avx2(auVar42,auVar48);
  auVar59 = vpmulld_avx2(auVar57,auVar52);
  auVar59 = vpaddd_avx2(auVar50,auVar59);
  auVar59 = vpaddd_avx2(auVar54,auVar59);
  auVar54 = vpaddd_avx2(auVar57,auVar42);
  auVar54 = vpmulld_avx2(auVar54,auVar52);
  auVar54 = vpaddd_avx2(auVar54,auVar50);
  local_180 = vpsrad_avx2(auVar59,auVar66);
  local_160 = vpsrad_avx2(auVar54,auVar66);
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,(__m256i *)&local_480,(__m256i *)&local_4a0
                    );
  return;
}

Assistant:

static void idct32_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m256i x[32];
  x[0] = input[0];
  x[4] = input[4];
  x[8] = input[2];
  x[12] = input[6];
  x[16] = input[1];
  x[20] = input[5];
  x[24] = input[3];
  x[28] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];

  // stage 4
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct32_high16_stage4_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  idct32_high24_stage5_avx2(x, cospi, _r, INV_COS_BIT);
  // stage 6
  x[3] = x[0];
  x[2] = x[1];
  idct32_high28_stage6_avx2(x, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x);
}